

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void hexdump(void *buf,int len)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)(uint)len;
  puts("\nHex dump");
  if (len < 1) {
    uVar1 = 0;
  }
  uVar2 = 0;
  while (uVar1 != uVar2) {
    printf("%02x",(ulong)*(byte *)((long)buf + uVar2));
    if ((uVar2 & 1) != 0) {
      putchar(0x20);
    }
    uVar2 = uVar2 + 1;
    if ((uVar2 & 0x1f) == 0) {
      putchar(10);
    }
  }
  putchar(10);
  return;
}

Assistant:

void hexdump(void *buf, int len)
{
        int n;
        unsigned char *p = buf;

        printf("\nHex dump\n");

        for (n = 0; n < len; n++) {
                printf("%02x", p[n]);

                if ((n + 1) % 2 == 0)
                        printf(" ");
                if ((n + 1) % 32 == 0)
                        printf("\n");
        }
        printf("\n");
}